

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture3DView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,LodPrecision *lodPrec,
              qpWatchDog *watchDog)

{
  Vec3 *w;
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  bool bVar4;
  ulong uVar5;
  Vec3 *s;
  int lodOffsNdx;
  int y;
  Vec3 *s_00;
  long lVar6;
  int z;
  ulong uVar7;
  Vec3 *s_01;
  uint uVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 in_XMM13_Db;
  undefined4 in_XMM13_Dc;
  undefined4 in_XMM13_Dd;
  Vec4 VVar18;
  Vector<float,_4> VVar19;
  Texture3DView TVar20;
  Vec2 clampedLod;
  Vec3 coordDy;
  Vec2 lodO;
  Vec2 lodBounds;
  Vec3 coordDx;
  Vec2 lodBias;
  Vec3 coord;
  Vec4 refPix;
  Vec4 resPix;
  Vec3 triR [2];
  Vec3 triT [2];
  Vec3 triS [2];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Texture3DView src;
  Vector<float,_3> local_2c4;
  Vector<float,_3> local_2b8;
  Vector<float,_3> local_2ac;
  Vec3 *local_2a0;
  int local_294;
  float local_290;
  float local_28c;
  float local_288;
  undefined4 uStack_284;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  float local_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined8 local_268;
  float local_260;
  Vector<float,_2> local_258;
  undefined8 local_250;
  int local_248;
  float local_240;
  float local_23c;
  int local_238;
  float local_234;
  undefined1 local_230 [24];
  ConstPixelBufferAccess *local_218;
  Vec4 *local_210;
  Vec4 *local_208;
  Vector<float,_2> local_200;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  undefined4 uStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [16];
  Vector<float,_4> local_1c8;
  Vec4 local_1b8;
  Vec3 local_1a8;
  float local_19c;
  float local_198;
  float local_194;
  Vec3 local_188;
  float local_17c;
  float local_178;
  float local_174;
  Vec3 local_168;
  float local_15c;
  float local_158;
  float local_154;
  Vec4 *local_150;
  ConstPixelBufferAccess *local_148;
  Sampler *local_140;
  ReferenceParams *local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  _Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_118;
  Texture3DView local_f8;
  undefined1 local_e8 [8];
  ConstPixelBufferAccess *pCStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  Vec3 local_58;
  float fStack_4c;
  undefined8 local_48;
  Vector<float,_3> local_3c;
  
  local_118._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_230._16_8_ = errorMask;
  local_148 = reference;
  TVar20 = getSubView(baseView,sampleParams->baseLevel,sampleParams->maxLevel);
  pCStack_e0 = TVar20.m_levels;
  local_e8._0_4_ = TVar20.m_numLevels;
  local_140 = &sampleParams->sampler;
  TVar20 = tcu::getEffectiveTextureView
                     ((Texture3DView *)local_e8,
                      (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                       *)&local_118,local_140);
  local_f8.m_levels = TVar20.m_levels;
  local_f8.m_numLevels = TVar20.m_numLevels;
  local_168.m_data[0] = *texCoord;
  local_188.m_data[0] = texCoord[1];
  local_168.m_data[1] = texCoord[3];
  local_168.m_data[2] = texCoord[6];
  local_15c = texCoord[9];
  local_188.m_data[1] = texCoord[4];
  fVar13 = 0.0;
  fVar14 = 0.0;
  local_188.m_data[2] = texCoord[7];
  local_17c = texCoord[10];
  local_1a8.m_data[0] = texCoord[2];
  local_1a8.m_data[1] = texCoord[5];
  local_1a8.m_data[2] = texCoord[8];
  local_19c = texCoord[0xb];
  if (local_f8.m_numLevels < 1) {
    local_250 = 0;
    local_248 = 0;
  }
  else {
    local_250 = *(undefined8 *)((local_f8.m_levels)->m_size).m_data;
    local_248 = ((local_f8.m_levels)->m_size).m_data[2];
  }
  local_278 = (float)(result->m_size).m_data[0];
  local_288 = (float)(result->m_size).m_data[1];
  local_58.m_data[0] = (sampleParams->super_RenderParams).w.m_data[0];
  local_58.m_data[1] = (sampleParams->super_RenderParams).w.m_data[1];
  local_58.m_data[2] = (sampleParams->super_RenderParams).w.m_data[2];
  fStack_4c = (sampleParams->super_RenderParams).w.m_data[3];
  local_48 = CONCAT44(local_58.m_data[1],local_58.m_data[2]);
  local_200.m_data[0] = 0.0;
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    local_200.m_data[0] = (sampleParams->super_RenderParams).bias;
  }
  local_e8 = (undefined1  [8])0xbf800000;
  pCStack_e0 = (ConstPixelBufferAccess *)0x3f800000;
  local_d8 = 0xbf80000000000000;
  uStack_d0 = 0x3f80000000000000;
  local_1c8.m_data[0] = -1.7146522e+38;
  uStack_284 = in_XMM13_Db;
  uStack_280 = in_XMM13_Dc;
  uStack_27c = in_XMM13_Dd;
  uStack_274 = in_XMM13_Db;
  uStack_270 = in_XMM13_Dc;
  uStack_26c = in_XMM13_Dd;
  local_218 = result;
  local_200.m_data[1] = local_200.m_data[0];
  local_198 = local_1a8.m_data[2];
  local_194 = local_1a8.m_data[1];
  local_178 = local_188.m_data[2];
  local_174 = local_188.m_data[1];
  local_158 = local_168.m_data[2];
  local_154 = local_168.m_data[1];
  VVar18 = tcu::RGBA::toVec((RGBA *)&local_1c8);
  fVar9 = VVar18.m_data[3];
  tcu::clear((PixelBufferAccess *)local_230._16_8_,&local_1b8);
  local_208 = &(sampleParams->super_RenderParams).colorBias;
  local_210 = &(sampleParams->super_RenderParams).colorScale;
  local_150 = &lookupPrec->colorThreshold;
  local_c8 = local_288;
  fStack_c4 = local_288;
  fStack_c0 = local_288;
  fStack_bc = local_288;
  local_b8 = local_278;
  fStack_b4 = local_278;
  fStack_b0 = local_278;
  fStack_ac = local_278;
  uVar7 = 0;
  local_294 = 0;
  local_138 = sampleParams;
  do {
    if ((local_218->m_size).m_data[1] <= (int)uVar7) {
      std::_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
      ~_Vector_base(&local_118);
      return local_294;
    }
    if (watchDog != (qpWatchDog *)0x0) {
      qpWatchDog_touch(watchDog);
    }
    local_1f8 = (float)(int)uVar7 + 0.5;
    local_78 = local_1f8 / local_288;
    auVar16._0_4_ = local_1f8 + 0.0625;
    auVar16._4_4_ = local_1f8 + -0.0625;
    auVar16._8_4_ = local_1f8 + 0.0;
    auVar16._12_4_ = local_1f8 + 0.0;
    auVar12._4_4_ = fStack_c4;
    auVar12._0_4_ = local_c8;
    auVar12._8_4_ = fStack_c0;
    auVar12._12_4_ = fStack_bc;
    local_a8 = divps(auVar16,auVar12);
    local_98 = local_288 - local_1f8;
    uStack_94 = uStack_284;
    uStack_90 = uStack_280;
    uStack_8c = uStack_27c;
    local_240 = 1.0 - local_78;
    y = 0;
    fVar10 = fVar9;
    fVar15 = fVar14;
    fStack_1f4 = fVar9;
    fStack_1f0 = fVar13;
    fStack_1ec = fVar14;
    local_130 = uVar7;
    fStack_74 = fVar9;
    fStack_70 = fVar13;
    fStack_6c = fVar14;
    while( true ) {
      z = (int)uVar7;
      if ((local_218->m_size).m_data[0] <= y) break;
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_1d8,(int)local_218,y,z);
      tcu::operator-((tcu *)&local_1c8,(Vector<float,_4> *)local_1d8,local_208);
      tcu::operator/((tcu *)&local_1b8,&local_1c8,local_210);
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_230,(int)local_148,y,z);
      tcu::operator-((tcu *)local_1d8,(Vector<float,_4> *)local_230,local_208);
      tcu::operator/((tcu *)&local_1c8,(Vector<float,_4> *)local_1d8,local_210);
      tcu::operator-((tcu *)local_230,&local_1b8,&local_1c8);
      VVar19 = tcu::abs<float,4>((tcu *)local_1d8,(Vector<float,_4> *)local_230);
      fVar9 = VVar19.m_data[3];
      tcu::lessThanEqual<float,4>((tcu *)&local_2ac,(Vector<float,_4> *)local_1d8,local_150);
      bVar4 = tcu::boolAll<4>((Vector<bool,_4> *)&local_2ac);
      if (!bVar4) {
        local_1e8 = (float)y + 0.5;
        auVar17._4_4_ = fVar10;
        auVar17._0_4_ = local_1e8;
        auVar17._8_4_ = 0;
        auVar17._12_4_ = fVar15;
        local_68._4_12_ = auVar17._4_12_;
        local_68._0_4_ = local_1e8 / local_278;
        auVar11._0_4_ = local_1e8 + 0.0625;
        auVar11._4_4_ = local_1e8 + -0.0625;
        auVar11._8_4_ = local_1e8 + 0.0;
        auVar11._12_4_ = local_1e8 + 0.0;
        auVar1._4_4_ = fStack_b4;
        auVar1._0_4_ = local_b8;
        auVar1._8_4_ = fStack_b0;
        auVar1._12_4_ = fStack_ac;
        auVar12 = divps(auVar11,auVar1);
        fVar13 = auVar12._4_4_ + (float)local_a8._4_4_;
        uStack_1e0 = 0;
        local_88 = local_278 - local_1e8;
        uStack_84 = uStack_274;
        uStack_80 = uStack_270;
        uStack_7c = uStack_26c;
        local_23c = 1.0 - (float)local_68._0_4_;
        uVar5 = (ulong)(1.0 < fVar13);
        local_128 = (ulong)(1.0 <= auVar12._0_4_ + (float)local_a8._0_4_);
        fVar14 = fVar13;
        fVar2 = 0.0;
        fVar3 = 0.0;
        local_238 = y;
        fStack_1e4 = fVar10;
        fStack_1dc = fVar15;
        do {
          fVar15 = fVar3;
          fVar10 = fVar2;
          y = local_238;
          if (local_128 < uVar5) {
            local_230._0_4_ = -1.7014636e+38;
            VVar18 = tcu::RGBA::toVec((RGBA *)local_230);
            fVar9 = VVar18.m_data[3];
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)local_230._16_8_,(Vec4 *)local_1d8,y,(int)uVar7,0);
            local_294 = local_294 + 1;
            break;
          }
          local_28c = local_1e8;
          local_290 = local_1f8;
          fVar14 = local_78;
          fVar13 = (float)local_68._0_4_;
          if (uVar5 != 0) {
            local_28c = local_88;
            local_290 = local_98;
            fVar14 = local_240;
            fVar13 = local_23c;
          }
          s = &local_168 + uVar5;
          w = &local_58 + uVar5;
          local_120 = uVar5;
          fVar9 = projectedTriInterpolate(s,w,fVar13,fVar14);
          s_01 = &local_188 + uVar5;
          fVar10 = projectedTriInterpolate(s_01,w,fVar13,fVar14);
          local_2a0 = (Vec3 *)CONCAT44(local_2a0._4_4_,fVar10);
          s_00 = &local_1a8 + uVar5;
          local_1d8._8_4_ = projectedTriInterpolate(s_00,w,fVar13,fVar14);
          local_1d8._4_4_ = local_2a0._0_4_;
          local_1d8._0_4_ = fVar9;
          fVar9 = triDerivateX(s,w,local_1e8,local_278,fVar14);
          local_2a0 = s_01;
          fVar10 = triDerivateX(s_01,w,local_1e8,local_278,fVar14);
          local_2ac.m_data[2] = triDerivateX(s_00,w,local_1e8,local_278,fVar14);
          local_2ac.m_data[0] = fVar9;
          local_2ac.m_data[1] = fVar10;
          tcu::Vector<int,_3>::cast<float>((Vector<int,_3> *)&local_2b8);
          tcu::operator*((tcu *)local_230,&local_2ac,&local_2b8);
          fVar14 = triDerivateY(s,w,local_1f8,local_288,fVar13);
          fVar9 = triDerivateY(local_2a0,w,local_1f8,local_288,fVar13);
          local_2b8.m_data[2] = triDerivateY(s_00,w,local_1f8,local_288,fVar13);
          local_2b8.m_data[0] = fVar14;
          local_2b8.m_data[1] = fVar9;
          tcu::Vector<int,_3>::cast<float>((Vector<int,_3> *)&local_2c4);
          tcu::operator*((tcu *)&local_2ac,&local_2b8,&local_2c4);
          fVar9 = 0.0;
          fVar13 = 0.0;
          fVar14 = 0.0;
          fVar10 = 0.0;
          fVar15 = 0.0;
          tcu::computeLodBoundsFromDerivates
                    ((tcu *)&local_258,(float)local_230._0_4_,(float)local_230._4_4_,
                     (float)local_230._8_4_,local_2ac.m_data[0],local_2ac.m_data[1],
                     local_2ac.m_data[2],lodPrec);
          for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
            fVar14 = *(float *)(local_e8 + lVar6 * 8) + local_28c;
            fVar10 = *(float *)(local_e8 + lVar6 * 8 + 4) + local_290;
            fVar9 = fVar10 / local_288;
            fVar13 = triDerivateX(s,w,fVar14,local_278,fVar9);
            local_234 = triDerivateX(local_2a0,w,fVar14,local_278,fVar9);
            local_2c4.m_data[2] = triDerivateX(s_00,w,fVar14,local_278,fVar9);
            local_2c4.m_data[1] = local_234;
            local_2c4.m_data[0] = fVar13;
            tcu::Vector<int,_3>::cast<float>((Vector<int,_3> *)&local_268);
            tcu::operator*((tcu *)&local_2b8,&local_2c4,(Vector<float,_3> *)&local_268);
            fVar14 = fVar14 / local_278;
            fVar13 = triDerivateY(s,w,fVar10,local_288,fVar14);
            fVar9 = triDerivateY(local_2a0,w,fVar10,local_288,fVar14);
            local_260 = triDerivateY(s_00,w,fVar10,local_288,fVar14);
            local_268 = CONCAT44(fVar9,fVar13);
            tcu::Vector<int,_3>::cast<float>((Vector<int,_3> *)&local_3c);
            tcu::operator*((tcu *)&local_2c4,(Vector<float,_3> *)&local_268,&local_3c);
            tcu::computeLodBoundsFromDerivates
                      ((tcu *)&local_268,local_2b8.m_data[0],local_2b8.m_data[1],local_2b8.m_data[2]
                       ,local_2c4.m_data[0],local_2c4.m_data[1],local_2c4.m_data[2],lodPrec);
            fVar9 = (float)((ulong)local_268 >> 0x20);
            fVar13 = 0.0;
            fVar14 = 0.0;
            uVar8 = -(uint)(local_258.m_data[0] <= (float)local_268);
            local_258.m_data[0] =
                 (float)(~uVar8 & (uint)(float)local_268 | (uint)local_258.m_data[0] & uVar8);
            fVar10 = (float)(~-(uint)(fVar9 <= local_258.m_data[1]) & (uint)fVar9 |
                            (uint)local_258.m_data[1] & -(uint)(fVar9 <= local_258.m_data[1]));
            fVar15 = 0.0;
            local_258.m_data[1] = fVar10;
          }
          tcu::operator+(&local_258,&local_200);
          local_268._0_4_ = local_138->minLod;
          local_268._4_4_ = local_138->maxLod;
          tcu::clampLodBounds((tcu *)&local_2b8,(Vec2 *)&local_2c4,(Vec2 *)&local_268,lodPrec);
          bVar4 = tcu::isLookupResultValid
                            (&local_f8,local_140,lookupPrec,(Vec3 *)local_1d8,(Vec2 *)&local_2b8,
                             &local_1b8);
          uVar5 = local_120 + 1;
          uVar7 = local_130;
          y = local_238;
          fVar2 = fVar10;
          fVar3 = fVar15;
        } while (!bVar4);
      }
      y = y + 1;
    }
    uVar7 = (ulong)(z + 1);
  } while( true );
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::Texture3DView&				baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture3DView					src					= getEffectiveTextureView(getSubView(baseView, sampleParams.baseLevel, sampleParams.maxLevel), srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4								tq					= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4								rq					= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const tcu::IVec3							srcSize				= tcu::IVec3(src.getWidth(), src.getHeight(), src.getDepth());

	// Coordinates and lod per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3								triR[2]				= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	const float									posEps				= 1.0f / float(1<<MIN_SUBPIXEL_BITS);

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const bool		tri0	= (wx-posEps)/dstW + (wy-posEps)/dstH <= 1.0f;
				const bool		tri1	= (wx+posEps)/dstW + (wy+posEps)/dstH >= 1.0f;

				bool			isOk	= false;

				DE_ASSERT(tri0 || tri1);

				// Pixel can belong to either of the triangles if it lies close enough to the edge.
				for (int triNdx = (tri0?0:1); triNdx <= (tri1?1:0); triNdx++)
				{
					const float		triWx	= triNdx ? dstW - wx : wx;
					const float		triWy	= triNdx ? dstH - wy : wy;
					const float		triNx	= triNdx ? 1.0f - nx : nx;
					const float		triNy	= triNdx ? 1.0f - ny : ny;

					const tcu::Vec3	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy));
					const tcu::Vec3	coordDx		= tcu::Vec3(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
															triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy),
															triDerivateX(triR[triNdx], triW[triNdx], wx, dstW, triNy)) * srcSize.asFloat();
					const tcu::Vec3	coordDy		= tcu::Vec3(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
															triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx),
															triDerivateY(triR[triNdx], triW[triNdx], wy, dstH, triNx)) * srcSize.asFloat();

					tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx.x(), coordDx.y(), coordDx.z(), coordDy.x(), coordDy.y(), coordDy.z(), lodPrec);

					// Compute lod bounds across lodOffsets range.
					for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
					{
						const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
						const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
						const float		nxo		= wxo/dstW;
						const float		nyo		= wyo/dstH;

						const tcu::Vec3	coordDxo	= tcu::Vec3(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
																triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo),
																triDerivateX(triR[triNdx], triW[triNdx], wxo, dstW, nyo)) * srcSize.asFloat();
						const tcu::Vec3	coordDyo	= tcu::Vec3(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
																triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo),
																triDerivateY(triR[triNdx], triW[triNdx], wyo, dstH, nxo)) * srcSize.asFloat();
						const tcu::Vec2	lodO		= tcu::computeLodBoundsFromDerivates(coordDxo.x(), coordDxo.y(), coordDxo.z(), coordDyo.x(), coordDyo.y(), coordDyo.z(), lodPrec);

						lodBounds.x() = de::min(lodBounds.x(), lodO.x());
						lodBounds.y() = de::max(lodBounds.y(), lodO.y());
					}

					const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);

					if (tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coord, clampedLod, resPix))
					{
						isOk = true;
						break;
					}
				}

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}